

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::RenderTextClipped
               (ImVec2 *pos_min,ImVec2 *pos_max,char *text,char *text_end,ImVec2 *text_size_if_known
               ,ImVec2 *align,ImRect *clip_rect)

{
  ImGuiContext *pIVar1;
  char *pcVar2;
  char *in_RCX;
  char *in_RDX;
  ImVec2 *in_RSI;
  ImVec2 *in_RDI;
  char *unaff_retaddr;
  char *in_stack_00000008;
  ImVec2 *in_stack_00000010;
  ImGuiWindow *window;
  ImGuiContext *g;
  int text_len;
  char *text_display_end;
  
  pcVar2 = FindRenderedTextEnd(in_RDX,in_RCX);
  pIVar1 = GImGui;
  if (((int)pcVar2 != (int)in_RDX) &&
     (RenderTextClippedEx((ImDrawList *)g,(ImVec2 *)window,in_stack_00000010,in_stack_00000008,
                          unaff_retaddr,in_RDI,(ImVec2 *)text_display_end,(ImRect *)align),
     (pIVar1->LogEnabled & 1U) != 0)) {
    LogRenderedText(in_RSI,in_RDX,in_RCX);
  }
  return;
}

Assistant:

void ImGui::RenderTextClipped(const ImVec2& pos_min, const ImVec2& pos_max, const char* text, const char* text_end, const ImVec2* text_size_if_known, const ImVec2& align, const ImRect* clip_rect)
{
    // Hide anything after a '##' string
    const char* text_display_end = FindRenderedTextEnd(text, text_end);
    const int text_len = (int)(text_display_end - text);
    if (text_len == 0)
        return;

    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    RenderTextClippedEx(window->DrawList, pos_min, pos_max, text, text_display_end, text_size_if_known, align, clip_rect);
    if (g.LogEnabled)
        LogRenderedText(&pos_min, text, text_display_end);
}